

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  DBErrors DVar13;
  _Manager_type *pp_Var14;
  LegacyDataSPKM *this_00;
  _Base_ptr p_Var15;
  LoadResult LVar16;
  LoadResult LVar17;
  LegacyScriptPubKeyMan *this_01;
  void *pvVar18;
  LoadResult LVar19;
  LoadResult LVar20;
  LoadResult LVar21;
  iterator iVar22;
  undefined8 uVar23;
  int parameters_1;
  long *plVar24;
  DBErrors DVar25;
  unsigned_long *value;
  CWallet *pCVar26;
  DBErrors DVar27;
  ulong uVar28;
  long lVar29;
  key_type *__k;
  long in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  DataStream prefix;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  int num_ckeys;
  int nMinVersion;
  set<std::pair<OutputType,_bool>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
  seen_spks;
  undefined8 in_stack_fffffffffffffda8;
  CWallet *pCVar32;
  undefined7 in_stack_fffffffffffffdb8;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var33;
  int local_20c;
  undefined1 local_208 [16];
  long local_1f8;
  char local_1e9;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  unique_lock<std::recursive_mutex> local_108;
  unique_lock<std::recursive_mutex> local_f8;
  _Any_data local_e8;
  _Manager_type local_d8;
  code *local_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  code *local_b0;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  undefined1 local_98 [16];
  _Base_ptr local_88;
  size_t local_80;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e9 = '\0';
  local_208 = (undefined1  [16])0x0;
  local_1f8 = 0;
  local_108._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_108._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_108);
  local_20c = 0x46c6c;
  bVar9 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&local_20c);
  iVar12 = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,"Wallet file version = %d, last client version = %d\n",iVar12,local_20c);
  auVar6._12_4_ = 0;
  auVar6._0_12_ = stack0xffffffffffffff5c;
  _local_a8 = (_Any_data)(auVar6 << 0x20);
  bVar10 = DatabaseBatch::Read<std::__cxx11::string,int>
                     ((this->m_batch)._M_t.
                      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                      .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &DBKeys::MINVERSION_abi_cxx11_,(int *)local_a8);
  DVar13 = LOAD_OK;
  bVar11 = true;
  if (bVar10) {
    DVar13 = LOAD_OK;
    if ((int)local_a8._0_4_ < 0x297ad) {
      pwallet->nWalletVersion = local_a8._0_4_;
    }
    else {
      DVar13 = TOO_NEW;
      bVar11 = false;
    }
  }
  if (bVar11) {
    value = (unsigned_long *)local_a8;
    bVar10 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                       ((this->m_batch)._M_t.
                        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &DBKeys::FLAGS_abi_cxx11_,value);
    DVar13 = LOAD_OK;
    bVar11 = true;
    if (bVar10) {
      bVar10 = CWallet::LoadWalletFlags(pwallet,(uint64_t)local_a8);
      if (!bVar10) {
        CWallet::WalletLogPrintf<>
                  (pwallet,
                   "Error reading wallet database: Unknown non-tolerable wallet flags found\n");
        DVar13 = TOO_NEW;
        bVar11 = false;
      }
    }
    iVar12 = local_20c;
    if (bVar11) {
      _Var33._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      pCVar32 = pwallet;
      bVar11 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
      if (bVar11) {
        plVar24 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
        do {
          plVar24 = (long *)*plVar24;
          if (plVar24 == (long *)0x0) {
            DVar25 = LOAD_OK;
            break;
          }
          local_98 = (undefined1  [16])0x0;
          _local_a8 = (_Any_data)0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [16])0x0;
          Serialize<DataStream,char>
                    ((DataStream *)local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar24 + 1));
          (*(_Var33._M_head_impl)->_vptr_DatabaseBatch[10])
                    (&local_148,_Var33._M_head_impl,
                     (_Invoker_type)(local_128._0_8_ + local_118._8_8_),
                     local_128._8_8_ - (long)(local_128._0_8_ + local_118._8_8_));
          if ((long *)local_148._M_unused._0_8_ == (long *)0x0) {
            local_c8._M_unused._M_object = &local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,plVar24[1],plVar24[2] + plVar24[1]);
            parameters_00._M_string_length = (size_type)pCVar32;
            parameters_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
            parameters_00.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffdb8;
            parameters_00.field_2._M_local_buf[7] = bVar9;
            parameters_00.field_2._8_8_ = _Var33._M_head_impl;
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pCVar32,"Error getting database cursor for \'%s\' records\n",parameters_00);
            value = (unsigned_long *)0x9;
            pp_Var14 = &local_b8;
            uVar23 = local_c8._M_unused._0_8_;
            if ((_Manager_type *)local_c8._M_unused._0_8_ != pp_Var14) {
LAB_001b004c:
              operator_delete((void *)uVar23,(ulong)(*pp_Var14 + 1));
            }
LAB_001b0057:
            bVar11 = false;
          }
          else {
            iVar12 = (**(code **)(*local_148._M_unused._M_object + 0x10))
                               (local_148._M_unused._M_object,
                                (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                                local_a8,(_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                          *)local_68);
            bVar11 = iVar12 == 2;
            if (!bVar11) {
              pp_Var14 = &local_d8;
              local_e8._M_unused._M_object = pp_Var14;
              pcVar3 = (pCVar32->m_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar3,pcVar3 + (pCVar32->m_name)._M_string_length);
              parameters._M_string_length = (size_type)pCVar32;
              parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
              parameters.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffdb8;
              parameters.field_2._M_local_buf[7] = bVar9;
              parameters.field_2._8_8_ = _Var33._M_head_impl;
              CWallet::WalletLogPrintf<std::__cxx11::string>
                        (pCVar32,
                         "Error: Unexpected legacy entry found in descriptor wallet %s. The wallet might have been tampered with or created with malicious intent.\n"
                         ,parameters);
              value = (unsigned_long *)&DAT_00000008;
              uVar23 = local_e8._M_unused._0_8_;
              if ((_Manager_type *)local_e8._M_unused._0_8_ != pp_Var14) goto LAB_001b004c;
              goto LAB_001b0057;
            }
          }
          DVar25 = (DBErrors)value;
          if ((long *)local_148._M_unused._0_8_ != (long *)0x0) {
            (**(code **)(*local_148._M_unused._M_object + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_128);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_68);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_a8);
        } while (bVar11);
      }
      else {
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
             ::_M_manager;
        LVar19 = LoadRecords(pwallet,_Var33._M_head_impl,(string *)&DBKeys::HDCHAIN_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_128 = (undefined1  [16])0x0;
        local_118._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
             ::_M_invoke;
        local_118._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
             ::_M_manager;
        LVar20 = LoadRecords(pwallet,_Var33._M_head_impl,(string *)&DBKeys::KEY_abi_cxx11_,
                             (LoadFunc *)local_128);
        if ((_Manager_type)local_118._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_118._0_8_)
                    ((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
        }
        DVar27 = LVar19.m_result;
        if ((int)LVar19.m_result <= (int)LVar20.m_result) {
          DVar27 = LVar20.m_result;
        }
        local_c8 = (_Any_data)0x0;
        local_b0 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                   ::_M_invoke;
        local_b8 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                   ::_M_manager;
        LVar19 = LoadRecords(pwallet,_Var33._M_head_impl,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
                             (LoadFunc *)&local_c8);
        if (local_b8 != (_Manager_type)0x0) {
          (*local_b8)(&local_c8,&local_c8,__destroy_functor);
        }
        if ((int)DVar27 <= (int)LVar19.m_result) {
          DVar27 = LVar19.m_result;
        }
        local_e8 = (_Any_data)0x0;
        local_d0 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                   ::_M_invoke;
        local_d8 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                   ::_M_manager;
        LVar21 = LoadRecords(pwallet,_Var33._M_head_impl,(string *)&DBKeys::CSCRIPT_abi_cxx11_,
                             (LoadFunc *)&local_e8);
        if (local_d8 != (_Manager_type)0x0) {
          (*local_d8)(&local_e8,&local_e8,__destroy_functor);
        }
        DVar25 = LVar21.m_result;
        if ((int)LVar21.m_result < (int)DVar27) {
          DVar25 = DVar27;
        }
        DVar27 = LOAD_OK;
        if (0 < (int)DVar25) {
          DVar27 = DVar25;
        }
        parameters_1 = LVar19.m_records;
        if ((0 < parameters_1) &&
           (((iVar12 == 50000 || (iVar12 == 40000)) && (DVar27 = NEED_REWRITE, 2 < (int)DVar25)))) {
          DVar27 = DVar25;
        }
        auStack_a0._0_4_ = 0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (_Base_ptr)auStack_a0;
        local_98 = auVar7 << 0x40;
        local_80 = 0;
        local_148._8_8_ = 0;
        local_148._M_unused._M_member_pointer = (offset_in__Undefined_class_to_subr)value;
        local_138._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
             ::_M_invoke;
        local_138._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
             ::_M_manager;
        pCVar26 = pCVar32;
        local_88 = (_Base_ptr)auStack_a0;
        LVar19 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::KEYMETA_abi_cxx11_,
                             (LoadFunc *)&local_148);
        if ((code *)local_138._0_8_ != (code *)0x0) {
          (*(code *)local_138._0_8_)(&local_148,&local_148,__destroy_functor);
        }
        if ((int)DVar27 <= (int)LVar19.m_result) {
          DVar27 = LVar19.m_result;
        }
        if (local_80 != 0) {
          this_00 = CWallet::GetLegacyDataSPKM(pCVar32);
          if (this_00 == (LegacyDataSPKM *)0x0) {
            DVar27 = CORRUPT;
            CWallet::WalletLogPrintf<>
                      (pCVar32,"Inactive HD Chains found but no Legacy ScriptPubKeyMan\n");
          }
          else {
            for (p_Var15 = (_Base_ptr)local_98._8_8_; p_Var15 != (_Base_ptr)auStack_a0;
                p_Var15 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15)) {
              auVar30[0] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0] == (char)p_Var15[1]._M_color);
              auVar30[1] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[1] == *(byte *)((long)&p_Var15[1]._M_color + 1));
              auVar30[2] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[2] == *(byte *)((long)&p_Var15[1]._M_color + 2));
              auVar30[3] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[3] == *(byte *)((long)&p_Var15[1]._M_color + 3));
              auVar30[4] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[4] == p_Var15[1].field_0x4);
              auVar30[5] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[5] == p_Var15[1].field_0x5);
              auVar30[6] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[6] == p_Var15[1].field_0x6);
              auVar30[7] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[7] == p_Var15[1].field_0x7);
              auVar30[8] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[8] == *(uchar *)&p_Var15[1]._M_parent);
              auVar30[9] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[9] == *(uchar *)((long)&p_Var15[1]._M_parent + 1));
              auVar30[10] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                              m_data._M_elems[10] == *(uchar *)((long)&p_Var15[1]._M_parent + 2));
              auVar30[0xb] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xb] == *(uchar *)((long)&p_Var15[1]._M_parent + 3));
              auVar30[0xc] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xc] == *(uchar *)((long)&p_Var15[1]._M_parent + 4));
              auVar30[0xd] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xd] == *(uchar *)((long)&p_Var15[1]._M_parent + 5));
              auVar30[0xe] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xe] == *(uchar *)((long)&p_Var15[1]._M_parent + 6));
              auVar30[0xf] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xf] == *(uchar *)((long)&p_Var15[1]._M_parent + 7));
              uVar1 = *(undefined4 *)&p_Var15[1]._M_left;
              uVar2 = *(undefined4 *)
                       ((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                        _M_elems + 0x10);
              auVar31[0] = -((char)uVar2 == (char)uVar1);
              auVar31[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
              auVar31[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
              auVar31[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
              auVar31[4] = 0xff;
              auVar31[5] = 0xff;
              auVar31[6] = 0xff;
              auVar31[7] = 0xff;
              auVar31[8] = 0xff;
              auVar31[9] = 0xff;
              auVar31[10] = 0xff;
              auVar31[0xb] = 0xff;
              auVar31[0xc] = 0xff;
              auVar31[0xd] = 0xff;
              auVar31[0xe] = 0xff;
              auVar31[0xf] = 0xff;
              auVar31 = auVar31 & auVar30;
              if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) {
                LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var15[1]._M_right);
              }
            }
          }
        }
        local_168 = (_Any_data)0x0;
        local_150 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_invoke;
        local_158 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_manager;
        LVar21 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::WATCHS_abi_cxx11_,
                             (LoadFunc *)&local_168);
        if (local_158 != (code *)0x0) {
          (*local_158)(&local_168,&local_168,__destroy_functor);
        }
        if ((int)DVar27 <= (int)LVar21.m_result) {
          DVar27 = LVar21.m_result;
        }
        local_188 = (_Any_data)0x0;
        local_170 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_invoke;
        local_178 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_manager;
        LVar16 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::WATCHMETA_abi_cxx11_,
                             (LoadFunc *)&local_188);
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,__destroy_functor);
        }
        if ((int)DVar27 <= (int)LVar16.m_result) {
          DVar27 = LVar16.m_result;
        }
        local_1a8 = (_Any_data)0x0;
        local_190 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_invoke;
        local_198 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_manager;
        LVar17 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::POOL_abi_cxx11_,
                             (LoadFunc *)&local_1a8);
        if (local_198 != (code *)0x0) {
          (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
        }
        DVar25 = LVar17.m_result;
        if ((int)LVar17.m_result < (int)DVar27) {
          DVar25 = DVar27;
        }
        local_1c8 = (_Any_data)0x0;
        local_1b0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_manager;
        LVar17 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::DEFAULTKEY_abi_cxx11_,
                             (LoadFunc *)&local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
        }
        DVar27 = LVar17.m_result;
        if ((int)LVar17.m_result < (int)DVar25) {
          DVar27 = DVar25;
        }
        local_1e8 = (_Any_data)0x0;
        local_1d0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_invoke;
        local_1d8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_manager;
        LVar17 = LoadRecords(pCVar26,_Var33._M_head_impl,(string *)&DBKeys::OLD_KEY_abi_cxx11_,
                             (LoadFunc *)&local_1e8);
        if (local_1d8 != (code *)0x0) {
          (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
        }
        DVar25 = LVar17.m_result;
        if ((int)LVar17.m_result < (int)DVar27) {
          DVar25 = DVar27;
        }
        pCVar32 = pCVar26;
        if ((int)DVar25 < 5) {
          iVar12 = parameters_1 + LVar20.m_records;
          CWallet::WalletLogPrintf<int,int,int,int>
                    (pCVar26,
                     "Legacy Wallet Keys: %u plaintext, %u encrypted, %u w/ metadata, %u total.\n",
                     LVar20.m_records,parameters_1,LVar19.m_records,iVar12);
          bVar11 = CWallet::IsLegacy(pCVar26);
          if (((bVar11) && (iVar12 + LVar21.m_records != LVar16.m_records + LVar19.m_records)) &&
             (this_01 = CWallet::GetLegacyScriptPubKeyMan(pCVar32),
             this_01 != (LegacyScriptPubKeyMan *)0x0)) {
            local_f8._M_device =
                 &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
                  super_recursive_mutex;
            local_f8._M_owns = false;
            std::unique_lock<std::recursive_mutex>::lock(&local_f8);
            LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
            std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
          }
        }
        std::
        _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
        ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                     *)local_a8);
      }
      if ((int)DVar13 < (int)DVar25) {
        DVar13 = DVar25;
      }
      _Var33._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_68._0_4_ = local_20c;
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_128._4_12_;
      local_128 = auVar4 << 0x20;
      auVar5._12_4_ = 0;
      auVar5._0_12_ = local_c8._4_12_;
      local_c8 = (_Any_data)(auVar5 << 0x20);
      _local_a8 = (_Any_data)0x0;
      local_98 = (undefined1  [16])0x0;
      pCVar26 = pCVar32;
      pvVar18 = operator_new(0x20);
      *(DatabaseBatch **)pvVar18 = _Var33._M_head_impl;
      *(undefined1 **)((long)pvVar18 + 8) = local_128;
      *(_Any_data **)((long)pvVar18 + 0x10) = &local_c8;
      *(undefined1 **)((long)pvVar18 + 0x18) = local_68;
      local_a8 = (undefined1  [8])pvVar18;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_manager;
      LVar19 = LoadRecords(pCVar32,_Var33._M_head_impl,
                           (string *)&DBKeys::WALLETDESCRIPTOR_abi_cxx11_,(LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      DVar27 = LVar19.m_result;
      if ((int)DVar27 < 5) {
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pCVar32,
                   "Descriptors: %u, Descriptor Keys: %u plaintext, %u encrypted, %u total.\n",
                   LVar19.m_records,local_128._0_4_,local_c8._0_4_,local_c8._0_4_ + local_128._0_4_)
        ;
      }
      DVar25 = DVar13;
      if ((int)DVar13 <= (int)DVar27) {
        DVar25 = DVar27;
      }
      DVar13 = UNKNOWN_DESCRIPTOR;
      if (DVar25 != UNKNOWN_DESCRIPTOR) {
        _Var33._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _local_a8 = (_Any_data)0x0;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_manager;
        LVar19 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::NAME_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_manager;
        LVar20 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::PURPOSE_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_128 = (undefined1  [16])0x0;
        local_118._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
             ::_M_invoke;
        local_118._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
             ::_M_manager;
        LVar21 = LoadRecords(pCVar32,_Var33._M_head_impl,(string *)&DBKeys::DESTDATA_abi_cxx11_,
                             (LoadFunc *)local_128);
        if ((_Manager_type)local_118._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_118._0_8_)
                    ((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
        }
        DVar13 = LVar20.m_result;
        if ((int)LVar20.m_result < (int)LVar19.m_result) {
          DVar13 = LVar19.m_result;
        }
        if ((int)DVar13 <= (int)LVar21.m_result) {
          DVar13 = LVar21.m_result;
        }
        DVar27 = LOAD_OK;
        if (0 < (int)DVar13) {
          DVar27 = DVar13;
        }
        if (DVar27 <= DVar25) {
          DVar27 = DVar25;
        }
        _Var33._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        local_1e9 = '\0';
        auStack_a0 = (undefined1  [8])local_208;
        local_a8 = (undefined1  [8])&local_1e9;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_manager;
        LVar19 = LoadRecords(pCVar26,_Var33._M_head_impl,(string *)&DBKeys::TX_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_manager;
        LVar20 = LoadRecords(pCVar26,_Var33._M_head_impl,(string *)&DBKeys::LOCKED_UTXO_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_128 = (undefined1  [16])0x0;
        local_118._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
             ::_M_invoke;
        local_118._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
             ::_M_manager;
        LVar21 = LoadRecords(pCVar26,_Var33._M_head_impl,(string *)&DBKeys::ORDERPOSNEXT_abi_cxx11_,
                             (LoadFunc *)local_128);
        if ((_Manager_type)local_118._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_118._0_8_)
                    ((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
        }
        DVar13 = LVar20.m_result;
        if ((int)LVar20.m_result < (int)LVar19.m_result) {
          DVar13 = LVar19.m_result;
        }
        if ((int)DVar13 <= (int)LVar21.m_result) {
          DVar13 = LVar21.m_result;
        }
        if ((int)DVar13 < 1) {
          DVar13 = LOAD_OK;
        }
        if (DVar13 <= DVar27) {
          DVar13 = DVar27;
        }
        uVar28 = (ulong)DVar13;
        _Var33._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        local_48 = (_Base_ptr)(local_68 + 8);
        local_68._8_4_ = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_48;
        local_58 = auVar8 << 0x40;
        local_40 = 0;
        local_a8 = (undefined1  [8])local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_,
                   DAT_006d0010 + DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
        p_Var15 = (_Base_ptr)auStack_78;
        local_88 = p_Var15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,DBKeys::ACTIVEINTERNALSPK_abi_cxx11_,
                   DAT_006d0030 + DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
        lVar29 = 0;
        DVar13 = LOAD_OK;
        do {
          local_128._8_8_ = (string *)(local_a8 + lVar29);
          local_128._0_8_ = local_68;
          local_118._8_8_ =
               std::
               _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
               ::_M_invoke;
          local_118._0_8_ =
               std::
               _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
               ::_M_manager;
          LVar19 = LoadRecords(pCVar26,_Var33._M_head_impl,(string *)(local_a8 + lVar29),
                               (LoadFunc *)local_128);
          if ((_Manager_type)local_118._0_8_ != (_Manager_type)0x0) {
            (*(code *)local_118._0_8_)
                      ((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
          }
          if ((int)DVar13 <= (int)LVar19.m_result) {
            DVar13 = LVar19.m_result;
          }
          lVar29 = lVar29 + 0x20;
        } while (lVar29 != 0x40);
        lVar29 = -0x40;
        pCVar32 = pCVar26;
        do {
          if (p_Var15 != p_Var15[-1]._M_left) {
            operator_delete(p_Var15[-1]._M_left,*(long *)p_Var15 + 1);
          }
          DVar27 = (DBErrors)uVar28;
          p_Var15 = p_Var15 + -1;
          lVar29 = lVar29 + 0x20;
        } while (lVar29 != 0);
        std::
        _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
                     *)local_68);
        if ((int)DVar27 < (int)DVar13) {
          DVar27 = DVar13;
        }
        _local_a8 = (_Any_data)0x0;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_manager;
        LVar19 = LoadRecords(pCVar26,(this->m_batch)._M_t.
                                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                     _M_head_impl,(string *)&DBKeys::MASTER_KEY_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        uVar28 = (ulong)LVar19 & 0xffffffff;
        if ((int)LVar19.m_result < (int)DVar27) {
          uVar28 = (ulong)DVar27;
        }
        while (DVar13 = (DBErrors)uVar28, DVar13 == LOAD_OK) {
          uVar23 = local_208._8_8_;
          if (local_208._0_8_ == local_208._8_8_) {
LAB_001b0bed:
            if ((bVar9 & local_20c == 0x46c6c) == 0) {
              DatabaseBatch::Write<std::__cxx11::string,int>
                        ((this->m_batch)._M_t.
                         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
            }
            if (local_1e9 == '\x01') {
              DVar13 = CWallet::ReorderTransactions(pCVar26);
            }
            CWallet::UpgradeKeyMetadata(pCVar26);
            CWallet::UpgradeDescriptorCache(pCVar26);
            break;
          }
          __k = (key_type *)local_208._0_8_;
          while (iVar22 = std::
                          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&(pCVar26->mapWallet)._M_h,__k),
                iVar22.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur != (__node_type *)0x0) {
            WriteTx(this,(CWalletTx *)
                         ((long)iVar22.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
            __k = __k + 1;
            if (__k == (key_type *)uVar23) goto LAB_001b0bed;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001b13a6;
          uVar23 = std::__throw_out_of_range("_Map_base::at");
          std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
          std::
          _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
          ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                       *)local_a8);
          __cxa_begin_catch(uVar23);
          pCVar26 = pCVar32;
          __cxa_end_catch();
          pCVar32 = pCVar26;
          uVar28 = 9;
        }
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
  if ((void *)local_208._0_8_ != (void *)0x0) {
    operator_delete((void *)local_208._0_8_,local_1f8 - local_208._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar13;
  }
LAB_001b13a6:
  __stack_chk_fail();
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}